

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_buffered_data.cpp
# Opt level: O1

void __thiscall
duckdb::BatchedBufferedData::MoveCompletedBatches
          (BatchedBufferedData *this,lock_guard<std::mutex> *lock)

{
  iterator *piVar1;
  _Elt_pointer puVar2;
  unsigned_long params;
  ulong params_1;
  BatchedBufferedData *pBVar3;
  _Alloc_hider _Var4;
  pointer this_00;
  idx_t iVar5;
  _Base_ptr p_Var6;
  InternalException *this_01;
  size_type params_2;
  _Base_ptr p_Var7;
  unsigned_long params_3;
  _Base_ptr p_Var8;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>_>
  pVar9;
  unsigned_long batch_index;
  type chunk;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> to_remove;
  ulong local_d0;
  BatchedBufferedData *local_c8;
  string local_c0;
  _Base_ptr local_a0;
  _Rb_tree_node_base *local_98;
  deque<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
  *local_90;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (ulong *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (ulong *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (ulong *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (ulong *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map(&local_88,0);
  p_Var6 = (this->buffer)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_98 = &(this->buffer)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var6 != local_98) {
    local_90 = (deque<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
                *)&this->read_queue;
    local_c8 = this;
    do {
      local_d0 = *(ulong *)(p_Var6 + 1);
      if (this->min_batch < local_d0) break;
      p_Var7 = p_Var6[1]._M_right;
      if (p_Var7 == p_Var6[2]._M_right) {
        params_3 = 0;
      }
      else {
        p_Var8 = p_Var6[2]._M_parent;
        local_a0 = p_Var6[2]._M_left;
        params_3 = 0;
        do {
          local_c0._M_dataplus._M_p = *(pointer *)p_Var7;
          *(undefined8 *)p_Var7 = 0;
          this_00 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                    operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                                *)&local_c0);
          iVar5 = DataChunk::GetAllocationSize(this_00);
          puVar2 = (this->read_queue).
                   super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (puVar2 == (this->read_queue).
                        super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            ::std::
            deque<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
            ::
            _M_push_back_aux<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>
                      (local_90,(unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                                 *)&local_c0);
          }
          else {
            (puVar2->super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>).
            _M_t.super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>.
            _M_t.
            super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
            super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl =
                 (DataChunk *)local_c0._M_dataplus._M_p;
            local_c0._M_dataplus._M_p = (pointer)0x0;
            piVar1 = &(this->read_queue).
                      super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
          }
          _Var4._M_p = local_c0._M_dataplus._M_p;
          if ((DataChunk *)local_c0._M_dataplus._M_p != (DataChunk *)0x0) {
            DataChunk::~DataChunk((DataChunk *)local_c0._M_dataplus._M_p);
            operator_delete(_Var4._M_p);
          }
          p_Var7 = (_Base_ptr)&p_Var7->_M_parent;
          if (p_Var7 == p_Var8) {
            p_Var7 = local_a0->_M_parent;
            local_a0 = (_Base_ptr)&local_a0->_M_parent;
            p_Var8 = p_Var7 + 0x10;
          }
          params_3 = params_3 + iVar5;
          this = local_c8;
        } while (p_Var7 != p_Var6[2]._M_right);
      }
      if (local_d0 < this->lowest_moved_batch) {
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,
                   "Lowest moved batch is %d, attempted to move %d afterwards\nAttempted to move %d chunks, of %d bytes in total\nmin_batch is %d"
                   ,"");
        pBVar3 = local_c8;
        params_1 = local_d0;
        params = local_c8->lowest_moved_batch;
        params_2 = ::std::
                   deque<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                   ::size((deque<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                           *)&p_Var6[1]._M_parent);
        InternalException::
        InternalException<unsigned_long,unsigned_long,unsigned_long,unsigned_long,unsigned_long>
                  (this_01,&local_c0,params,params_1,params_2,params_3,pBVar3->min_batch);
        __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      this->lowest_moved_batch = local_d0;
      LOCK();
      (this->buffer_byte_count).super___atomic_base<unsigned_long>._M_i =
           (this->buffer_byte_count).super___atomic_base<unsigned_long>._M_i - params_3;
      UNLOCK();
      LOCK();
      (this->read_queue_byte_count).super___atomic_base<unsigned_long>._M_i =
           (this->read_queue_byte_count).super___atomic_base<unsigned_long>._M_i + params_3;
      UNLOCK();
      if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        ::std::deque<unsigned_long,std::allocator<unsigned_long>>::
        _M_push_back_aux<unsigned_long_const&>
                  ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_88,&local_d0);
      }
      else {
        *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_d0;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      p_Var6 = (_Base_ptr)::std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != local_98);
  }
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
        local_c0._M_dataplus._M_p =
             (pointer)local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f];
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_finish._M_first);
        local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_c0._M_dataplus._M_p =
             (pointer)local_88._M_impl.super__Deque_impl_data._M_finish._M_cur[-1];
        local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      pVar9 = ::std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::InProgressBatch>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>_>
              ::equal_range(&(this->buffer)._M_t,(key_type *)&local_c0);
      ::std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::InProgressBatch>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>_>
      ::_M_erase_aux(&(this->buffer)._M_t,(_Base_ptr)pVar9.first._M_node,
                     (_Base_ptr)pVar9.second._M_node);
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_88);
  return;
}

Assistant:

void BatchedBufferedData::MoveCompletedBatches(lock_guard<mutex> &lock) {
	stack<idx_t> to_remove;
	for (auto &it : buffer) {
		auto batch_index = it.first;
		auto &in_progress_batch = it.second;
		if (batch_index > min_batch) {
			break;
		}
		D_ASSERT(in_progress_batch.completed || batch_index == min_batch);
		// min_batch - took longer than others
		// min_batch+1 - completed before min_batch
		// min_batch+2 - completed before min_batch
		// new min_batch
		//
		// To preserve the order, the completed batches have to be processed before we can start scanning the "new
		// min_batch"
		auto &chunks = in_progress_batch.chunks;

		idx_t batch_allocation_size = 0;
		for (auto it = chunks.begin(); it != chunks.end(); it++) {
			auto chunk = std::move(*it);
			auto allocation_size = chunk->GetAllocationSize();
			batch_allocation_size += allocation_size;
			read_queue.push_back(std::move(chunk));
		}
		// Verification to make sure we're not breaking the order by moving batches before the previous ones have
		// finished
		if (lowest_moved_batch > batch_index) {
			throw InternalException("Lowest moved batch is %d, attempted to move %d afterwards\nAttempted to move %d "
			                        "chunks, of %d bytes in total\nmin_batch is %d",
			                        lowest_moved_batch, batch_index, chunks.size(), batch_allocation_size, min_batch);
		}
		D_ASSERT(lowest_moved_batch <= batch_index);
		lowest_moved_batch = batch_index;

		buffer_byte_count -= batch_allocation_size;
		read_queue_byte_count += batch_allocation_size;
		to_remove.push(batch_index);
	}
	while (!to_remove.empty()) {
		auto batch_index = to_remove.top();
		to_remove.pop();
		buffer.erase(batch_index);
	}
}